

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall server_response::remove_waiting_task_id(server_response *this,int id_task)

{
  const_iterator __last;
  size_type sVar1;
  iterator this_00;
  uint in_ESI;
  const_iterator in_RDI;
  unique_lock<std::mutex> lock;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  unique_lock<std::mutex> *in_stack_ffffffffffffff60;
  anon_class_4_1_e5de0d09_for__M_pred __pred;
  __normal_iterator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_*,_std::vector<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>_>
  in_stack_ffffffffffffff70;
  __normal_iterator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_*,_std::vector<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>_>
  in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  
  if (0 < common_log_verbosity_thold) {
    in_stack_ffffffffffffff78._M_current =
         (unique_ptr<server_task_result,_std::default_delete<server_task_result>_> *)
         common_log_main();
    sVar1 = httplib::detail::std::
            unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::size
                      ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *)0x259906);
    in_stack_ffffffffffffff58 = (undefined4)sVar1;
    common_log_add((common_log *)in_stack_ffffffffffffff78._M_current,GGML_LOG_LEVEL_DEBUG,
                   "srv  %12.*s: remove task %d from waiting list. current waiting = %d (before remove)\n"
                   ,0xc,"remove_waiting_task_id",(ulong)in_ESI);
    in_stack_ffffffffffffff84 = in_ESI;
  }
  httplib::detail::std::unique_lock<std::mutex>::unique_lock
            (in_stack_ffffffffffffff60,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  httplib::detail::std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::erase((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
          in_stack_ffffffffffffff60,
          (key_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  __pred.id_task = (int)((ulong)(in_RDI._M_current + 8) >> 0x20);
  httplib::detail::std::
  vector<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>
  ::begin((vector<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>
           *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  httplib::detail::std::
  vector<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>
  ::end((vector<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>
         *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::
  remove_if<__gnu_cxx::__normal_iterator<std::unique_ptr<server_task_result,std::default_delete<server_task_result>>*,std::vector<std::unique_ptr<server_task_result,std::default_delete<server_task_result>>,std::allocator<std::unique_ptr<server_task_result,std::default_delete<server_task_result>>>>>,server_response::remove_waiting_task_id(int)::_lambda(std::unique_ptr<server_task_result,std::default_delete<server_task_result>>const&)_1_>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,__pred);
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<server_task_result,std::default_delete<server_task_result>>const*,std::vector<std::unique_ptr<server_task_result,std::default_delete<server_task_result>>,std::allocator<std::unique_ptr<server_task_result,std::default_delete<server_task_result>>>>>
  ::__normal_iterator<std::unique_ptr<server_task_result,std::default_delete<server_task_result>>*>
            ((__normal_iterator<const_std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_*,_std::vector<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>_>
              *)in_stack_ffffffffffffff60,
             (__normal_iterator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_*,_std::vector<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  httplib::detail::std::
  vector<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>
  ::end((vector<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>
         *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<server_task_result,std::default_delete<server_task_result>>const*,std::vector<std::unique_ptr<server_task_result,std::default_delete<server_task_result>>,std::allocator<std::unique_ptr<server_task_result,std::default_delete<server_task_result>>>>>
  ::__normal_iterator<std::unique_ptr<server_task_result,std::default_delete<server_task_result>>*>
            ((__normal_iterator<const_std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_*,_std::vector<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>_>
              *)in_stack_ffffffffffffff60,
             (__normal_iterator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_*,_std::vector<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  __last._M_current._4_4_ = in_stack_ffffffffffffff84;
  __last._M_current._0_4_ = in_stack_ffffffffffffff80;
  this_00 = httplib::detail::std::
            vector<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>
            ::erase((vector<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>
                     *)in_stack_ffffffffffffff78._M_current,in_RDI,__last);
  httplib::detail::std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)this_00._M_current);
  return;
}

Assistant:

void remove_waiting_task_id(int id_task) {
        SRV_DBG("remove task %d from waiting list. current waiting = %d (before remove)\n", id_task, (int) waiting_task_ids.size());

        std::unique_lock<std::mutex> lock(mutex_results);
        waiting_task_ids.erase(id_task);
        // make sure to clean up all pending results
        queue_results.erase(
            std::remove_if(queue_results.begin(), queue_results.end(), [id_task](const server_task_result_ptr & res) {
                return res->id == id_task;
            }),
            queue_results.end());
    }